

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall
AmpIO::WriteDoutControl(AmpIO *this,uint index,uint16_t countsHigh,uint16_t countsLow)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 5) {
    pcVar5 = "AmpIO::WriteDoutControl: requires firmware 5 or above";
    lVar4 = 0x35;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 != 0x64524131) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      if (pBVar1 == (BasePort *)0x0) {
        return false;
      }
      if (this->NumDouts <= index) {
        return false;
      }
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)(index * 0x10 + 0x18),(ulong)CONCAT22(countsLow,countsHigh));
      return SUB41(iVar3,0);
    }
    pcVar5 = "AmpIO::WriteDoutControl not implemented for dRAC";
    lVar4 = 0x30;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return false;
}

Assistant:

bool AmpIO::WriteDoutControl(unsigned int index, uint16_t countsHigh, uint16_t countsLow)
{
    if (GetFirmwareVersion() < 5) {
        std::cerr << "AmpIO::WriteDoutControl: requires firmware 5 or above" << std::endl;
        return false;
    }
    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "AmpIO::WriteDoutControl not implemented for dRAC" << std::endl;
        return false;
    }

    // Counter frequency = 49.152 MHz --> 1 count is about 0.02 uS
    //    Max high/low time = (2^16-1)/49.152 usec = 1333.3 usec = 1.33 msec
    //    The max PWM period with full adjustment of duty cycle (1-65535) is (2^16-1+1)/49.152 usec = 1.33 msec
    unsigned int channel = (index+1) << 4;
    if (port && (index < NumDouts)) {
        // Starting with Version 1.3.0 of this library, we swap the high and low times
        // because the digital outputs are inverted in hardware.
        uint32_t counts = (static_cast<uint32_t>(countsLow) << 16) | countsHigh;
        return port->WriteQuadlet(BoardId, channel | DOUT_CTRL_REG, counts);
    } else {
        return false;
    }
}